

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckAtomicAlign
          (SharedValidator *this,Location *loc,Address alignment,Address natural_alignment)

{
  undefined4 in_register_0000000c;
  ulong uVar1;
  char *format;
  
  uVar1 = (ulong)alignment;
  if (alignment - 1 < (alignment ^ alignment - 1)) {
    if (alignment == natural_alignment) {
      return (Result)Ok;
    }
    format = "alignment must be equal to natural alignment (%u)";
    uVar1 = CONCAT44(in_register_0000000c,natural_alignment);
  }
  else {
    format = "alignment (%u) must be a power of 2";
  }
  PrintError(this,loc,format,uVar1);
  return (Result)Error;
}

Assistant:

Result SharedValidator::CheckAtomicAlign(const Location& loc,
                                         Address alignment,
                                         Address natural_alignment) {
  if (!is_power_of_two(alignment)) {
    PrintError(loc, "alignment (%u) must be a power of 2", alignment);
    return Result::Error;
  }
  if (alignment != natural_alignment) {
    PrintError(loc, "alignment must be equal to natural alignment (%u)",
               natural_alignment);
    return Result::Error;
  }
  return Result::Ok;
}